

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames
                    (ma_dr_flac *pFlac,ma_uint64 offset)

{
  ma_dr_flac *pmVar1;
  ma_dr_flac *in_RSI;
  ma_uint64 in_stack_ffffffffffffffe8;
  
  pmVar1 = (ma_dr_flac *)ma_dr_flac__seek_forward_by_pcm_frames(in_RSI,in_stack_ffffffffffffffe8);
  return (ma_bool32)(pmVar1 == in_RSI);
}

Assistant:

static ma_bool32 ma_dr_flac__decode_flac_frame_and_seek_forward_by_pcm_frames(ma_dr_flac* pFlac, ma_uint64 offset)
{
#if 0
    if (ma_dr_flac__decode_flac_frame(pFlac) != MA_SUCCESS) {
        if (ma_dr_flac__read_and_decode_next_flac_frame(pFlac) == MA_FALSE) {
            return MA_FALSE;
        }
    }
#endif
    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, offset) == offset;
}